

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::chooseColumn(HEkkPrimal *this,bool hyper_sparse)

{
  double dVar1;
  int ix_00;
  uint uVar2;
  HEkk *pHVar3;
  pointer piVar4;
  byte bVar5;
  int iVar6;
  pointer pdVar7;
  ulong uVar8;
  undefined7 in_register_00000031;
  HighsInt ix;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  pHVar3 = this->ekk_instance_;
  this->variable_in = -1;
  if ((int)CONCAT71(in_register_00000031,hyper_sparse) == 0) {
    uVar10 = 0;
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x29,0);
    uVar2 = (this->nonbasic_free_col_set).count_;
    if (uVar2 == 0) {
      dVar11 = this->dual_feasibility_tolerance;
      pdVar7 = (this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar12 = 0.0;
    }
    else {
      piVar4 = (this->nonbasic_free_col_set).entry_.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar11 = this->dual_feasibility_tolerance;
      pdVar7 = (this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar8 = uVar10;
      }
      dVar12 = 0.0;
      for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        iVar6 = piVar4[uVar10];
        dVar13 = (pHVar3->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar6];
        if (dVar11 < ABS(dVar13)) {
          dVar1 = pdVar7[iVar6];
          if (dVar12 * dVar1 < dVar13 * dVar13) {
            this->variable_in = iVar6;
            dVar12 = (dVar13 * dVar13) / dVar1;
          }
        }
      }
    }
    uVar8 = 0;
    uVar10 = (ulong)(uint)this->num_tot;
    if (this->num_tot < 1) {
      uVar10 = uVar8;
    }
    for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      dVar13 = (double)-(int)(pHVar3->basis_).nonbasicMove_.
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar8] *
               (pHVar3->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start[uVar8];
      if (dVar11 < dVar13) {
        dVar1 = pdVar7[uVar8];
        if (dVar12 * dVar1 < dVar13 * dVar13) {
          this->variable_in = (HighsInt)uVar8;
          dVar12 = (dVar13 * dVar13) / dVar1;
        }
      }
    }
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x29,0);
    return;
  }
  bVar5 = this->initialise_hyper_chuzc;
  if ((bool)bVar5 == false) {
    hyperChooseColumn(this);
    bVar5 = this->initialise_hyper_chuzc;
  }
  if ((bVar5 & 1) != 0) {
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x2a,0);
    this->num_hyper_chuzc_candidates = 0;
    iVar6 = (this->nonbasic_free_col_set).count_;
    if (iVar6 != 0) {
      for (lVar9 = 0; lVar9 < iVar6; lVar9 = lVar9 + 1) {
        ix_00 = (this->nonbasic_free_col_set).entry_.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar9];
        dVar11 = (pHVar3->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[ix_00];
        if (this->dual_feasibility_tolerance <= ABS(dVar11) &&
            ABS(dVar11) != this->dual_feasibility_tolerance) {
          addToDecreasingHeap(&this->num_hyper_chuzc_candidates,this->max_num_hyper_chuzc_candidates
                              ,&this->hyper_chuzc_measure,&this->hyper_chuzc_candidate,
                              (dVar11 * dVar11) /
                              (this->edge_weight_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[ix_00],ix_00);
          iVar6 = (this->nonbasic_free_col_set).count_;
        }
      }
    }
    for (lVar9 = 0; lVar9 < this->num_tot; lVar9 = lVar9 + 1) {
      dVar11 = (double)-(int)(pHVar3->basis_).nonbasicMove_.
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar9] *
               (pHVar3->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start[lVar9];
      if (this->dual_feasibility_tolerance <= dVar11 && dVar11 != this->dual_feasibility_tolerance)
      {
        addToDecreasingHeap(&this->num_hyper_chuzc_candidates,this->max_num_hyper_chuzc_candidates,
                            &this->hyper_chuzc_measure,&this->hyper_chuzc_candidate,
                            (dVar11 * dVar11) /
                            (this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar9],(HighsInt)lVar9);
      }
    }
    sortDecreasingHeap(this->num_hyper_chuzc_candidates,&this->hyper_chuzc_measure,
                       &this->hyper_chuzc_candidate);
    this->initialise_hyper_chuzc = false;
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x2a,0);
    if ((long)this->num_hyper_chuzc_candidates != 0) {
      pdVar7 = (this->hyper_chuzc_measure).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      this->variable_in =
           (this->hyper_chuzc_candidate).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[1];
      dVar11 = pdVar7[1];
      this->max_hyper_chuzc_non_candidate_measure = pdVar7[this->num_hyper_chuzc_candidates];
      if (this->report_hyper_chuzc == true) {
        printf("Full CHUZC: Max         measure is %9.4g for column %4d, and max non-candidate measure of  %9.4g\n"
               ,dVar11);
        return;
      }
    }
  }
  return;
}

Assistant:

void HEkkPrimal::chooseColumn(const bool hyper_sparse) {
  assert(!hyper_sparse || !done_next_chuzc);
  const vector<int8_t>& nonbasicMove = ekk_instance_.basis_.nonbasicMove_;
  const vector<double>& workDual = ekk_instance_.info_.workDual_;
  double best_measure = 0;
  variable_in = -1;

  const bool local_use_hyper_chuzc = hyper_sparse;
  // Consider nonbasic free columns first
  const HighsInt& num_nonbasic_free_col = nonbasic_free_col_set.count();
  if (local_use_hyper_chuzc) {
    if (!initialise_hyper_chuzc) hyperChooseColumn();
    if (initialise_hyper_chuzc) {
      analysis->simplexTimerStart(ChuzcHyperInitialiselClock);
      num_hyper_chuzc_candidates = 0;
      if (num_nonbasic_free_col) {
        const vector<HighsInt>& nonbasic_free_col_set_entry =
            nonbasic_free_col_set.entry();
        for (HighsInt ix = 0; ix < num_nonbasic_free_col; ix++) {
          HighsInt iCol = nonbasic_free_col_set_entry[ix];
          double dual_infeasibility = fabs(workDual[iCol]);
          if (dual_infeasibility > dual_feasibility_tolerance) {
            double measure =
                dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
            addToDecreasingHeap(
                num_hyper_chuzc_candidates, max_num_hyper_chuzc_candidates,
                hyper_chuzc_measure, hyper_chuzc_candidate, measure, iCol);
          }
        }
      }
      // Now look at other columns
      for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
        double dual_infeasibility = -nonbasicMove[iCol] * workDual[iCol];
        if (dual_infeasibility > dual_feasibility_tolerance) {
          double measure =
              dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
          addToDecreasingHeap(
              num_hyper_chuzc_candidates, max_num_hyper_chuzc_candidates,
              hyper_chuzc_measure, hyper_chuzc_candidate, measure, iCol);
        }
      }
      // Sort the heap
      sortDecreasingHeap(num_hyper_chuzc_candidates, hyper_chuzc_measure,
                         hyper_chuzc_candidate);
      initialise_hyper_chuzc = false;
      analysis->simplexTimerStop(ChuzcHyperInitialiselClock);
      // Choose the first entry - if there is one
      if (num_hyper_chuzc_candidates) {
        variable_in = hyper_chuzc_candidate[1];
        best_measure = hyper_chuzc_measure[1];
        max_hyper_chuzc_non_candidate_measure =
            hyper_chuzc_measure[num_hyper_chuzc_candidates];
        if (report_hyper_chuzc)
          printf(
              "Full CHUZC: Max         measure is %9.4g for column "
              "%4" HIGHSINT_FORMAT
              ", and "
              "max non-candidate measure of  %9.4g\n",
              best_measure, variable_in, max_hyper_chuzc_non_candidate_measure);
      }
    }
  } else {
    analysis->simplexTimerStart(ChuzcPrimalClock);
    // Choose any attractive nonbasic free column
    if (num_nonbasic_free_col) {
      const vector<HighsInt>& nonbasic_free_col_set_entry =
          nonbasic_free_col_set.entry();
      for (HighsInt ix = 0; ix < num_nonbasic_free_col; ix++) {
        HighsInt iCol = nonbasic_free_col_set_entry[ix];
        double dual_infeasibility = fabs(workDual[iCol]);
        if (dual_infeasibility > dual_feasibility_tolerance &&
            dual_infeasibility * dual_infeasibility >
                best_measure * edge_weight_[iCol]) {
          variable_in = iCol;
          best_measure =
              dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
        }
      }
    }
    // Now look at other columns
    for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
      double dual_infeasibility = -nonbasicMove[iCol] * workDual[iCol];
      if (dual_infeasibility > dual_feasibility_tolerance &&
          dual_infeasibility * dual_infeasibility >
              best_measure * edge_weight_[iCol]) {
        variable_in = iCol;
        best_measure =
            dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
      }
    }
    analysis->simplexTimerStop(ChuzcPrimalClock);
  }
  //  printf("ChooseColumn: Iteration %" HIGHSINT_FORMAT ", choose column %"
  //  HIGHSINT_FORMAT " with measure %g\n",
  //	 ekk_instance_.iteration_count_, variable_in, best_measure);
}